

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__hdr_info(stbi__context *s,int *x,int *y,int *comp)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcStack_440;
  int valid;
  char *token;
  char buffer [1024];
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  bVar1 = false;
  iVar2 = stbi__hdr_test(s);
  if (iVar2 == 0) {
    stbi__rewind(s);
    s_local._4_4_ = 0;
  }
  else {
    while (pcStack_440 = stbi__hdr_gettoken(s,(char *)&token), *pcStack_440 != '\0') {
      iVar2 = strcmp(pcStack_440,"FORMAT=32-bit_rle_rgbe");
      if (iVar2 == 0) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      pcStack_440 = stbi__hdr_gettoken(s,(char *)&token);
      iVar2 = strncmp(pcStack_440,"-Y ",3);
      if (iVar2 == 0) {
        pcStack_440 = pcStack_440 + 3;
        lVar3 = strtol(pcStack_440,&stack0xfffffffffffffbc0,10);
        *y = (int)lVar3;
        for (; *pcStack_440 == ' '; pcStack_440 = pcStack_440 + 1) {
        }
        iVar2 = strncmp(pcStack_440,"+X ",3);
        if (iVar2 == 0) {
          pcStack_440 = pcStack_440 + 3;
          lVar3 = strtol(pcStack_440,(char **)0x0,10);
          *x = (int)lVar3;
          *comp = 3;
          s_local._4_4_ = 1;
        }
        else {
          stbi__rewind(s);
          s_local._4_4_ = 0;
        }
      }
      else {
        stbi__rewind(s);
        s_local._4_4_ = 0;
      }
    }
    else {
      stbi__rewind(s);
      s_local._4_4_ = 0;
    }
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__hdr_info(stbi__context *s, int *x, int *y, int *comp)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;

   if (stbi__hdr_test(s) == 0) {
       stbi__rewind( s );
       return 0;
   }

   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid) {
       stbi__rewind( s );
       return 0;
   }
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3)) {
       stbi__rewind( s );
       return 0;
   }
   token += 3;
   *y = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3)) {
       stbi__rewind( s );
       return 0;
   }
   token += 3;
   *x = (int) strtol(token, NULL, 10);
   *comp = 3;
   return 1;
}